

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O0

int exit_status(void)

{
  char *pcVar1;
  int local_c;
  int retval;
  
  local_c = 0;
  if (expected_tests == -1) {
    printf("1..%d\n",(ulong)(uint)current_test);
  }
  else if (current_test != expected_tests) {
    pcVar1 = "";
    if (1 < expected_tests) {
      pcVar1 = "s";
    }
    diag("Looks like you planned %d test%s but ran %d.",(ulong)(uint)expected_tests,pcVar1,
         (ulong)(uint)current_test);
    local_c = 2;
  }
  if (failed_tests != 0) {
    pcVar1 = "";
    if (1 < failed_tests) {
      pcVar1 = "s";
    }
    diag("Looks like you failed %d test%s of %d run.",(ulong)(uint)failed_tests,pcVar1,
         (ulong)(uint)current_test);
    local_c = 1;
  }
  return local_c;
}

Assistant:

int
exit_status () {
    int retval = 0;
    if (expected_tests == NO_PLAN) {
        printf("1..%d\n", current_test);
    }
    else if (current_test != expected_tests) {
        diag("Looks like you planned %d test%s but ran %d.",
            expected_tests, expected_tests > 1 ? "s" : "", current_test);
        retval = 2;
    }
    if (failed_tests) {
        diag("Looks like you failed %d test%s of %d run.",
            failed_tests, failed_tests > 1 ? "s" : "", current_test);
        retval = 1;
    }
    return retval;
}